

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextClassifier.pb.h
# Opt level: O2

bool CoreML::Specification::operator==(TextClassifier *a,TextClassifier *b)

{
  string *psVar1;
  size_t __n;
  string *psVar2;
  bool bVar3;
  int iVar4;
  StringVector *a_00;
  StringVector *b_00;
  
  if (a->revision_ != b->revision_) {
    return false;
  }
  bVar3 = std::operator!=((a->language_).ptr_,(b->language_).ptr_);
  if ((!bVar3) && (a->_oneof_case_[0] == b->_oneof_case_[0])) {
    if (a->_oneof_case_[0] == 200) {
      a_00 = CoreMLModels::TextClassifier::stringclasslabels(a);
      b_00 = CoreMLModels::TextClassifier::stringclasslabels(b);
      bVar3 = operator!=(a_00,b_00);
      if (bVar3) {
        return false;
      }
    }
    psVar1 = (a->modelparameterdata_).ptr_;
    __n = psVar1->_M_string_length;
    psVar2 = (b->modelparameterdata_).ptr_;
    if ((__n == psVar2->_M_string_length) &&
       ((__n == 0 ||
        (iVar4 = bcmp((psVar1->_M_dataplus)._M_p,(psVar2->_M_dataplus)._M_p,__n), iVar4 == 0)))) {
      return true;
    }
  }
  return false;
}

Assistant:

inline ::google::protobuf::uint32 TextClassifier::revision() const {
  // @@protoc_insertion_point(field_get:CoreML.Specification.CoreMLModels.TextClassifier.revision)
  return revision_;
}